

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset_inline.hpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::indset::iteration<Omega_h::QualityCompare>
          (indset *this,Mesh *mesh,Int dim,LOs *xadj,LOs *adj,Read<signed_char> *old_state,
          QualityCompare *compare)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Read<signed_char> RVar4;
  Read<signed_char> local_state;
  Read<signed_char> local_90;
  LOs local_80;
  LOs local_70;
  Alloc *local_60;
  undefined8 local_58;
  Alloc *local_50;
  undefined8 local_48;
  QualityCompare local_40;
  void *pvVar3;
  
  local_70.write_.shared_alloc_.alloc = (xadj->write_).shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = (xadj->write_).shared_alloc_.direct_ptr;
  local_80.write_.shared_alloc_.alloc = (adj->write_).shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.write_.shared_alloc_.alloc)->use_count =
           (local_80.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (adj->write_).shared_alloc_.direct_ptr;
  local_90.write_.shared_alloc_.alloc = (old_state->write_).shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (old_state->write_).shared_alloc_.direct_ptr;
  local_40.quality.write_.shared_alloc_.alloc = (compare->quality).write_.shared_alloc_.alloc;
  if (((ulong)local_40.quality.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.quality.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.quality.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.quality.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.quality.write_.shared_alloc_.alloc)->use_count =
           (local_40.quality.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.quality.write_.shared_alloc_.direct_ptr =
       (compare->quality).write_.shared_alloc_.direct_ptr;
  local_40.global.write_.shared_alloc_.alloc = (compare->global).write_.shared_alloc_.alloc;
  if (((ulong)local_40.global.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.global.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.global.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.global.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.global.write_.shared_alloc_.alloc)->use_count =
           (local_40.global.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.global.write_.shared_alloc_.direct_ptr =
       (compare->global).write_.shared_alloc_.direct_ptr;
  local_iteration<Omega_h::QualityCompare>
            ((indset *)&local_50,&local_70,&local_80,&local_90,&local_40);
  pAVar2 = local_40.global.write_.shared_alloc_.alloc;
  if (((ulong)local_40.global.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.global.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.global.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.global.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_40.quality.write_.shared_alloc_.alloc;
  if (((ulong)local_40.quality.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.quality.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.quality.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.quality.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_60 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_58 = local_48;
  RVar4 = Omega_h::Mesh::sync_array<signed_char>
                    ((Mesh *)this,(Int)mesh,(Read<signed_char> *)(ulong)(uint)dim,(Int)&local_60);
  pAVar2 = local_60;
  pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> iteration(Mesh* mesh, Int dim, LOs xadj, LOs adj, Read<I8> old_state,
    Compare compare) {
  auto local_state = local_iteration(xadj, adj, old_state, compare);
  auto synced_state = mesh->sync_array(dim, local_state, 1);
  return synced_state;
}